

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeBatchResult.cpp
# Opt level: O3

void __thiscall xe::TestCaseResultData::TestCaseResultData(TestCaseResultData *this,char *casePath)

{
  allocator<char> local_9;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)this,casePath,&local_9);
  this->m_statusCode = TESTSTATUSCODE_LAST;
  (this->m_statusDetails)._M_dataplus._M_p = (pointer)&(this->m_statusDetails).field_2;
  (this->m_statusDetails)._M_string_length = 0;
  (this->m_statusDetails).field_2._M_local_buf[0] = '\0';
  (this->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

TestCaseResultData::TestCaseResultData (const char* casePath)
	: m_casePath	(casePath)
	, m_statusCode	(TESTSTATUSCODE_LAST)
{
}